

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptRegExp * __thiscall Js::JavascriptLibrary::CreateEmptyRegExp(JavascriptLibrary *this)

{
  RegexPattern *pattern;
  ScriptContext *this_00;
  Recycler *pRVar1;
  JavascriptRegExp *this_01;
  RegexPattern **ppRVar2;
  DynamicType *type;
  TrackAllocData local_38;
  JavascriptLibrary *local_10;
  JavascriptLibrary *this_local;
  
  local_10 = this;
  this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  pRVar1 = ScriptContext::GetRecycler(this_00);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_38,(type_info *)&JavascriptRegExp::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x1518);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_38);
  this_01 = (JavascriptRegExp *)new<Memory::Recycler>(0x40,pRVar1,0x43c4b0);
  ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RegexPattern__
                      ((WriteBarrierPtr *)&this->emptyRegexPattern);
  pattern = *ppRVar2;
  type = GetRegexType(this);
  JavascriptRegExp::JavascriptRegExp(this_01,pattern,type);
  return this_01;
}

Assistant:

JavascriptRegExp* JavascriptLibrary::CreateEmptyRegExp()
    {
        return RecyclerNew(scriptContext->GetRecycler(), JavascriptRegExp, emptyRegexPattern,
                           this->GetRegexType());
    }